

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::StrPair::ParseName(StrPair *this,char *p)

{
  bool bVar1;
  bool local_31;
  char *start;
  char *p_local;
  StrPair *this_local;
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    this_local = (StrPair *)0x0;
  }
  else {
    bVar1 = XMLUtil::IsNameStartChar(*p);
    if (bVar1) {
      start = p + 1;
      while( true ) {
        local_31 = false;
        if (*start != '\0') {
          local_31 = XMLUtil::IsNameChar(*start);
        }
        if (local_31 == false) break;
        start = start + 1;
      }
      Set(this,p,start,0);
      this_local = (StrPair *)start;
    }
    else {
      this_local = (StrPair *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

char* StrPair::ParseName( char* p )
{
    if ( !p || !(*p) ) {
        return 0;
    }
    if ( !XMLUtil::IsNameStartChar( (unsigned char) *p ) ) {
        return 0;
    }

    char* const start = p;
    ++p;
    while ( *p && XMLUtil::IsNameChar( (unsigned char) *p ) ) {
        ++p;
    }

    Set( start, p, 0 );
    return p;
}